

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Image.c
# Opt level: O1

void Llb_Nonlin4Free(Llb_Mgr_t_conflict *p)

{
  long lVar1;
  
  if (0 < p->nVars) {
    lVar1 = 0;
    do {
      if (p->pVars[lVar1] != (Llb_Var_t *)0x0) {
        Llb_Nonlin4RemoveVar(p,p->pVars[lVar1]);
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < p->nVars);
  }
  if (0 < p->iPartFree) {
    lVar1 = 0;
    do {
      if (p->pParts[lVar1] != (Llb_Prt_t *)0x0) {
        Llb_Nonlin4RemovePart(p,p->pParts[lVar1]);
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < p->iPartFree);
  }
  if (p->pVars != (Llb_Var_t **)0x0) {
    free(p->pVars);
    p->pVars = (Llb_Var_t **)0x0;
  }
  if (p->pParts != (Llb_Prt_t **)0x0) {
    free(p->pParts);
    p->pParts = (Llb_Prt_t **)0x0;
  }
  if (p->pSupp != (int *)0x0) {
    free(p->pSupp);
    p->pSupp = (int *)0x0;
  }
  if (p != (Llb_Mgr_t_conflict *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Llb_Nonlin4Free( Llb_Mgr_t * p )
{
    Llb_Prt_t * pPart;
    Llb_Var_t * pVar;
    int i;
    Llb_MgrForEachVar( p, pVar, i )
        Llb_Nonlin4RemoveVar( p, pVar );
    Llb_MgrForEachPart( p, pPart, i )
        Llb_Nonlin4RemovePart( p, pPart );
    ABC_FREE( p->pVars );
    ABC_FREE( p->pParts );
    ABC_FREE( p->pSupp );
    ABC_FREE( p );
}